

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonwriter.cpp
# Opt level: O2

void __thiscall CJsonWriter::WriteIntValue(CJsonWriter *this,int Value)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  char aBuf [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CanWriteDatatype(this);
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/jsonwriter.cpp"
                 ,0x58,(uint)bVar2,"Cannot write value at this position");
  WriteIndent(this,false);
  str_format(aBuf,0x20,"%d",Value);
  WriteInternal(this,aBuf);
  CompleteDataType(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CJsonWriter::WriteIntValue(int Value)
{
	dbg_assert(CanWriteDatatype(), "Cannot write value at this position");
	WriteIndent(false);
	char aBuf[32];
	str_format(aBuf, sizeof(aBuf), "%d", Value);
	WriteInternal(aBuf);
	CompleteDataType();
}